

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcForwardIntersect4Ex
               (int *valid,RTCIntersectFunctionNArguments *args,RTCScene hscene,RTCRay4 *iray,
               uint instID,uint instPrimID)

{
  RTCRayQueryContext *pRVar1;
  RTCRayHitN *pRVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  Scene *scene;
  RayQueryContext context;
  
  pRVar1 = args->context;
  pRVar2 = args->rayhit;
  uVar6 = *(undefined8 *)pRVar2;
  uVar7 = *(undefined8 *)(pRVar2 + 8);
  uVar8 = *(undefined8 *)(pRVar2 + 0x10);
  uVar9 = *(undefined8 *)(pRVar2 + 0x18);
  uVar10 = *(undefined8 *)(pRVar2 + 0x20);
  uVar11 = *(undefined8 *)(pRVar2 + 0x28);
  uVar12 = *(undefined8 *)(pRVar2 + 0x40);
  uVar13 = *(undefined8 *)(pRVar2 + 0x48);
  uVar14 = *(undefined8 *)(pRVar2 + 0x50);
  uVar15 = *(undefined8 *)(pRVar2 + 0x58);
  uVar16 = *(undefined8 *)(pRVar2 + 0x60);
  uVar17 = *(undefined8 *)(pRVar2 + 0x68);
  uVar18 = *(undefined8 *)(iray->org_x + 2);
  *(undefined8 *)pRVar2 = *(undefined8 *)iray->org_x;
  *(undefined8 *)(pRVar2 + 8) = uVar18;
  uVar18 = *(undefined8 *)(iray->org_y + 2);
  *(undefined8 *)(pRVar2 + 0x10) = *(undefined8 *)iray->org_y;
  *(undefined8 *)(pRVar2 + 0x18) = uVar18;
  uVar18 = *(undefined8 *)(iray->org_z + 2);
  *(undefined8 *)(pRVar2 + 0x20) = *(undefined8 *)iray->org_z;
  *(undefined8 *)(pRVar2 + 0x28) = uVar18;
  uVar18 = *(undefined8 *)(iray->dir_x + 2);
  *(undefined8 *)(pRVar2 + 0x40) = *(undefined8 *)iray->dir_x;
  *(undefined8 *)(pRVar2 + 0x48) = uVar18;
  uVar18 = *(undefined8 *)(iray->dir_y + 2);
  *(undefined8 *)(pRVar2 + 0x50) = *(undefined8 *)iray->dir_y;
  *(undefined8 *)(pRVar2 + 0x58) = uVar18;
  fVar3 = iray->dir_z[1];
  fVar4 = iray->dir_z[2];
  fVar5 = iray->dir_z[3];
  *(float *)(pRVar2 + 0x60) = iray->dir_z[0];
  *(float *)(pRVar2 + 100) = fVar3;
  *(float *)(pRVar2 + 0x68) = fVar4;
  *(float *)(pRVar2 + 0x6c) = fVar5;
  context.args = *(RTCIntersectArguments **)&args[1].primID;
  if (pRVar1->instID[0] == 0xffffffff) {
    pRVar1->instID[0] = instID;
    pRVar1->instPrimID[0] = instPrimID;
  }
  context.scene = (Scene *)hscene;
  context.user = pRVar1;
  (**(code **)(hscene + 0x98))(valid,hscene + 0x58,pRVar2,&context);
  pRVar1->instID[0] = 0xffffffff;
  pRVar1->instPrimID[0] = 0xffffffff;
  *(undefined8 *)pRVar2 = uVar6;
  *(undefined8 *)(pRVar2 + 8) = uVar7;
  *(undefined8 *)(pRVar2 + 0x10) = uVar8;
  *(undefined8 *)(pRVar2 + 0x18) = uVar9;
  *(undefined8 *)(pRVar2 + 0x20) = uVar10;
  *(undefined8 *)(pRVar2 + 0x28) = uVar11;
  *(undefined8 *)(pRVar2 + 0x40) = uVar12;
  *(undefined8 *)(pRVar2 + 0x48) = uVar13;
  *(undefined8 *)(pRVar2 + 0x50) = uVar14;
  *(undefined8 *)(pRVar2 + 0x58) = uVar15;
  *(undefined8 *)(pRVar2 + 0x60) = uVar16;
  *(undefined8 *)(pRVar2 + 0x68) = uVar17;
  return;
}

Assistant:

RTC_API void rtcForwardIntersect4Ex(const int* valid, const RTCIntersectFunctionNArguments* args, RTCScene hscene, RTCRay4* iray, unsigned int instID, unsigned int instPrimID)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcForwardIntersect4);
    rtcForwardIntersectN<RTCRay4,RTCRayHit4,4>(valid,args,hscene,iray,instID,instPrimID);
    RTC_CATCH_END2(scene);
  }